

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O3

void __thiscall
ByteData_GetVariableIntTest_Test::~ByteData_GetVariableIntTest_Test
          (ByteData_GetVariableIntTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData, GetVariableIntTest) {
  const uint8_t vi_max8 = 252;
  std::map<const uint64_t, const std::string> test_vector = {
    {0, "00"},
    {1, "01"},
    {static_cast<uint64_t>(vi_max8)-1, "fb"},
    {static_cast<uint64_t>(vi_max8), "fc"},
    {static_cast<uint64_t>(vi_max8)+1, "fdfd00"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())-1, "fdfeff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max()), "fdffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())+1, "fe00000100"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())-1, "fefeffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max()), "feffffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())+1, "ff0000000001000000"},
    {std::numeric_limits<uint64_t>::max()-1, "fffeffffffffffffff"},
    {std::numeric_limits<uint64_t>::max(), "ffffffffffffffffff"},
  };

  ByteData var_int_bytes;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(var_int_bytes = ByteData::GetVariableInt(citr->first));
    EXPECT_STREQ(var_int_bytes.GetHex().c_str(), citr->second.c_str());
    ++citr;
  }
}